

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::RgbaInputFile::FromYca::setFrameBuffer
          (FromYca *this,Rgba *base,size_t xStride,size_t yStride,string *channelNamePrefix)

{
  undefined8 in_RCX;
  size_t in_RDX;
  _Base_ptr in_RSI;
  FrameBuffer *in_RDI;
  FrameBuffer fb;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  string local_190 [32];
  Slice local_170;
  string local_138 [32];
  Slice local_118;
  string local_e0 [32];
  Slice local_c0;
  string local_78 [88];
  undefined8 local_20;
  size_t local_18;
  _Base_ptr local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDI[7]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) {
    FrameBuffer::FrameBuffer((FrameBuffer *)0x2207d7);
    std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice(&local_c0,HALF,
                 (char *)((long)&(in_RDI[7]._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left)->_M_color +
                         (long)(0xd - *(int *)&in_RDI[1]._map._M_t._M_impl.field_0x4) * 8 + 2),8,0,1
                 ,1,0.5,false,false);
    FrameBuffer::insert(in_RDI,(string *)CONCAT44(in_stack_fffffffffffffe2c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe24,uVar1));
    std::__cxx11::string::~string(local_78);
    if ((undefined1  [48])((undefined1  [48])in_RDI[1]._map._M_t._M_impl & (undefined1  [48])0x1) !=
        (undefined1  [48])0x0) {
      std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      uVar2 = 0;
      uVar1 = 0;
      Slice::Slice(&local_118,HALF,
                   (char *)(&(in_RDI[7]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                             _M_color +
                           (long)(0xd - *(int *)&in_RDI[1]._map._M_t._M_impl.field_0x4) * 2),0x10,0,
                   2,2,0.0,false,false);
      FrameBuffer::insert(in_RDI,(string *)CONCAT44(in_stack_fffffffffffffe2c,uVar2),
                          (Slice *)CONCAT44(in_stack_fffffffffffffe24,uVar1));
      std::__cxx11::string::~string(local_e0);
      std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      uVar2 = 0;
      uVar1 = 0;
      Slice::Slice(&local_170,HALF,
                   &(in_RDI[7]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->field_0x4
                   + (long)(0xd - *(int *)&in_RDI[1]._map._M_t._M_impl.field_0x4) * 8,0x10,0,2,2,0.0
                   ,false,false);
      FrameBuffer::insert(in_RDI,(string *)CONCAT44(in_stack_fffffffffffffe2c,uVar2),
                          (Slice *)CONCAT44(in_stack_fffffffffffffe24,uVar1));
      std::__cxx11::string::~string(local_138);
    }
    std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    uVar3 = 0;
    uVar2 = 0;
    uVar1 = 1;
    Slice::Slice((Slice *)&stack0xfffffffffffffe38,HALF,
                 &(in_RDI[7]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->field_0x6 +
                 (long)(0xd - *(int *)&in_RDI[1]._map._M_t._M_impl.field_0x4) * 8,8,0,1,1,1.0,false,
                 false);
    FrameBuffer::insert(in_RDI,(string *)CONCAT44(in_stack_fffffffffffffe2c,uVar3),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe24,uVar2));
    std::__cxx11::string::~string(local_190);
    InputPart::setFrameBuffer
              ((InputPart *)CONCAT44(in_stack_fffffffffffffe24,uVar2),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffffe1c,uVar1));
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x220b23);
  }
  in_RDI[7]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_10;
  in_RDI[7]._map._M_t._M_impl.super__Rb_tree_header._M_node_count = local_18;
  *(undefined8 *)&in_RDI[8]._map._M_t._M_impl = local_20;
  return;
}

Assistant:

void
RgbaInputFile::FromYca::setFrameBuffer (
    Rgba* base, size_t xStride, size_t yStride, const string& channelNamePrefix)
{
    if (_fbBase == 0)
    {
        FrameBuffer fb;

        fb.insert (
            channelNamePrefix + "Y",
            Slice (
                HALF,                           // type
                (char*) &_tmpBuf[N2 - _xMin].g, // base
                sizeof (Rgba),                  // xStride
                0,                              // yStride
                1,                              // xSampling
                1,                              // ySampling
                0.5));                          // fillValue

        if (_readC)
        {
            fb.insert (
                channelNamePrefix + "RY",
                Slice (
                    HALF,                           // type
                    (char*) &_tmpBuf[N2 - _xMin].r, // base
                    sizeof (Rgba) * 2,              // xStride
                    0,                              // yStride
                    2,                              // xSampling
                    2,                              // ySampling
                    0.0));                          // fillValue

            fb.insert (
                channelNamePrefix + "BY",
                Slice (
                    HALF,                           // type
                    (char*) &_tmpBuf[N2 - _xMin].b, // base
                    sizeof (Rgba) * 2,              // xStride
                    0,                              // yStride
                    2,                              // xSampling
                    2,                              // ySampling
                    0.0));                          // fillValue
        }

        fb.insert (
            channelNamePrefix + "A",
            Slice (
                HALF,                           // type
                (char*) &_tmpBuf[N2 - _xMin].a, // base
                sizeof (Rgba),                  // xStride
                0,                              // yStride
                1,                              // xSampling
                1,                              // ySampling
                1.0));                          // fillValue

        _inputPart.setFrameBuffer (fb);
    }

    _fbBase    = base;
    _fbXStride = xStride;
    _fbYStride = yStride;
}